

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O1

ostream * perf::operator<<(ostream *o,suite *suite)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  function<bool_()> *pfVar4;
  ostream *poVar5;
  function<bool_()> *pfVar6;
  ulong uVar7;
  char *pcVar8;
  function<bool_()> *pfVar9;
  duration *time;
  char cVar10;
  ulong uVar11;
  function<bool_()> *__x;
  string __str_1;
  string num_str;
  string name_str;
  string success_str;
  string num_cases_str;
  string time_str;
  perf_case c;
  string local_158;
  unsigned_long local_138;
  function<bool_()> *local_130;
  char *local_128;
  ulong local_120;
  char local_118;
  undefined7 uStack_117;
  char *local_108;
  ulong local_100;
  char local_f8;
  undefined7 uStack_f7;
  ostream *local_e8;
  char *local_e0;
  char *local_d8;
  char local_d0;
  undefined7 uStack_cf;
  long *local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  long local_b0 [2];
  char *local_a0;
  long local_98;
  char local_90;
  undefined7 uStack_8f;
  _Any_data local_80;
  code *local_70;
  long *local_60;
  long local_58;
  long local_50 [2];
  undefined8 local_40;
  undefined8 uStack_38;
  
  uVar11 = (*(long *)(suite + 8) - *(long *)suite >> 4) * -0x3333333333333333;
  cVar10 = '\x01';
  if (9 < uVar11) {
    uVar7 = uVar11;
    cVar3 = '\x04';
    do {
      cVar10 = cVar3;
      if (uVar7 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_00103c8e;
      }
      if (uVar7 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_00103c8e;
      }
      if (uVar7 < 10000) goto LAB_00103c8e;
      bVar2 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_00103c8e:
  local_c0 = local_b0;
  local_e8 = o;
  std::__cxx11::string::_M_construct((ulong)&local_c0,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c0,local_b8,uVar11);
  __x = *(function<bool_()> **)suite;
  local_130 = *(function<bool_()> **)(suite + 8);
  pfVar4 = (function<bool_()> *)&__x[2].super__Function_base._M_manager;
  pfVar6 = __x;
  pfVar9 = __x;
  if (pfVar4 != local_130 && __x != local_130) {
    do {
      pfVar6 = pfVar4;
      if (*(ulong *)((long)&pfVar4[1].super__Function_base._M_functor + 8) <=
          *(ulong *)((long)&pfVar9[1].super__Function_base._M_functor + 8)) {
        pfVar6 = pfVar9;
      }
      pfVar4 = (function<bool_()> *)&pfVar4[2].super__Function_base._M_manager;
      pfVar9 = pfVar6;
    } while (pfVar4 != local_130);
  }
  local_128 = &local_118;
  local_120 = 0;
  local_118 = '\0';
  local_108 = &local_f8;
  local_100 = 0;
  local_f8 = '\0';
  local_e0 = &local_d0;
  local_d8 = (char *)0x0;
  local_d0 = '\0';
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = '\0';
  if (__x != local_130) {
    uVar11 = *(long *)((long)&pfVar6[1].super__Function_base._M_functor + 8) + 1;
    local_138 = 0;
    do {
      std::function<bool_()>::function((function<bool_()> *)&local_80,__x);
      local_60 = local_50;
      lVar1 = *(long *)&__x[1].super__Function_base._M_functor;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,lVar1,
                 *(long *)((long)&__x[1].super__Function_base._M_functor + 8) + lVar1);
      local_40 = *(undefined8 *)&__x[2].super__Function_base._M_functor;
      uStack_38 = *(undefined8 *)((long)&__x[2].super__Function_base._M_functor + 8);
      local_138 = local_138 + 1;
      cVar10 = '\x01';
      if (9 < local_138) {
        uVar7 = local_138;
        cVar3 = '\x04';
        do {
          cVar10 = cVar3;
          if (uVar7 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_00103e1a;
          }
          if (uVar7 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_00103e1a;
          }
          if (uVar7 < 10000) goto LAB_00103e1a;
          bVar2 = 99999 < uVar7;
          uVar7 = uVar7 / 10000;
          cVar3 = cVar10 + '\x04';
        } while (bVar2);
        cVar10 = cVar10 + '\x01';
      }
LAB_00103e1a:
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_158,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_158._M_dataplus._M_p,(uint)local_158._M_string_length,local_138);
      std::__cxx11::string::operator=((string *)&local_128,(string *)&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      uVar7 = CONCAT44(uStack_b4,local_b8);
      while (local_120 < uVar7) {
        std::__cxx11::string::push_back((char)(string *)&local_128);
      }
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_60,local_58 + (long)local_60);
      std::__cxx11::string::_M_replace_aux
                ((ulong)&local_158,
                 CONCAT44(local_158._M_string_length._4_4_,(uint)local_158._M_string_length),0,
                 '\x01');
      std::__cxx11::string::operator=((string *)&local_108,(string *)&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      cVar10 = (char)(string *)&local_108;
      if (uVar11 < 0x1e) {
        while (local_100 < 0x1e) {
          std::__cxx11::string::push_back(cVar10);
        }
      }
      else {
        while (local_100 < uVar11) {
          std::__cxx11::string::push_back(cVar10);
        }
      }
      pcVar8 = "  Failed  ";
      if ((char)local_40 != '\0') {
        pcVar8 = "  Passed  ";
      }
      std::__cxx11::string::_M_replace((ulong)&local_e0,0,local_d8,(ulong)pcVar8);
      format_duration_abi_cxx11_(&local_158,(perf *)&uStack_38,time);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_e8,local_128,local_120);
      local_158._M_dataplus._M_p._0_1_ = 0x2f;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_158,1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_c0,CONCAT44(uStack_b4,local_b8));
      local_158._M_dataplus._M_p._0_1_ = 0x20;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_158,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Case #",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_128,local_120);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_108,local_100);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_e0,(long)local_d8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_a0,local_98);
      local_158._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_158,1);
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      if (local_70 != (code *)0x0) {
        (*local_70)(&local_80,&local_80,__destroy_functor);
      }
      __x = (function<bool_()> *)&__x[2].super__Function_base._M_manager;
    } while (__x != local_130);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  return local_e8;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const suite &suite)
    {
        auto num_cases = suite.m_cases.size();
        auto num_cases_str = std::to_string(num_cases);

        auto max_name_length = std::max_element(std::begin(suite.m_cases), std::end(suite.m_cases), [](const perf_case &a, const perf_case &b)
                                                { return a.name.size() < b.name.size(); })
                                   ->name.size();

        auto num = 0ul;
        auto num_str = std::string(), name_str = std::string(), success_str = std::string(), time_str = std::string();
        for (auto c : suite.m_cases)
        {
            num++;
            num_str = std::to_string(num);
            lengthen_string(num_str, num_cases_str.length());
            name_str = c.name + ' ';
            if (30 > max_name_length + 1)
            {
                lengthen_string(name_str, 30, '.');
            }
            else
            {
                lengthen_string(name_str, max_name_length + 1, '.');
            }
            if (c.success)
                success_str = "  Passed  ";
            else
                success_str = "  Failed  ";
            time_str = format_duration(c.time);

            o << num_str << '/' << num_cases_str << ' ' << "Case #" << num_str << ": " << name_str << success_str << time_str << '\n';
        }

        return o;
    }